

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_deserialize(sqlite3 *db,char *zSchema,uchar *pData,sqlite3_int64 szDb,
                       sqlite3_int64 szBuf,uint mFlags)

{
  undefined1 *puVar1;
  MemStore *pMVar2;
  int iVar3;
  int iVar4;
  char *zSql;
  MemFile *pMVar5;
  sqlite3_stmt *pStmt_00;
  long in_FS_OFFSET;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zSchema == (char *)0x0) {
    zSchema = db->aDb->zDbSName;
  }
  iVar3 = sqlite3FindDbName(db,zSchema);
  if (iVar3 < 2 && iVar3 != 0) {
    pStmt_00 = (sqlite3_stmt *)0x0;
  }
  else {
    pStmt_00 = (sqlite3_stmt *)0x0;
    zSql = sqlite3_mprintf("ATTACH x AS %Q",zSchema);
    if (zSql == (char *)0x0) {
      iVar4 = 7;
      goto LAB_00122bf8;
    }
    iVar4 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_40,(char **)0x0);
    sqlite3_free(zSql);
    pStmt_00 = local_40;
    if (iVar4 != 0) goto LAB_00122bf8;
    (db->init).iDb = (u8)iVar3;
    puVar1 = &(db->init).field_0x6;
    *puVar1 = *puVar1 | 4;
    iVar3 = sqlite3_step(local_40);
    puVar1 = &(db->init).field_0x6;
    *puVar1 = *puVar1 & 0xfb;
    if ((iVar3 == 0x65) && (pMVar5 = memdbFromDbSchema(db,zSchema), pMVar5 != (MemFile *)0x0)) {
      pMVar2 = pMVar5->pStore;
      pMVar2->aData = pData;
      pMVar2->sz = szDb;
      pMVar2->szAlloc = szBuf;
      if (szBuf < sqlite3Config.mxMemdbSize) {
        szBuf = sqlite3Config.mxMemdbSize;
      }
      pMVar2->szMax = szBuf;
      pMVar2->mFlags = mFlags;
      pData = (uchar *)0x0;
      iVar4 = 0;
      goto LAB_00122bf8;
    }
  }
  iVar4 = 1;
LAB_00122bf8:
  sqlite3_finalize(pStmt_00);
  if ((mFlags & 1) != 0 && pData != (uchar *)0x0) {
    sqlite3_free(pData);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_deserialize(
  sqlite3 *db,            /* The database connection */
  const char *zSchema,    /* Which DB to reopen with the deserialization */
  unsigned char *pData,   /* The serialized database content */
  sqlite3_int64 szDb,     /* Number bytes in the deserialization */
  sqlite3_int64 szBuf,    /* Total size of buffer pData[] */
  unsigned mFlags         /* Zero or more SQLITE_DESERIALIZE_* flags */
){
  MemFile *p;
  char *zSql;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int iDb;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( szDb<0 ) return SQLITE_MISUSE_BKPT;
  if( szBuf<0 ) return SQLITE_MISUSE_BKPT;
#endif

  sqlite3_mutex_enter(db->mutex);
  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  iDb = sqlite3FindDbName(db, zSchema);
  testcase( iDb==1 );
  if( iDb<2 && iDb!=0 ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  zSql = sqlite3_mprintf("ATTACH x AS %Q", zSchema);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    sqlite3_free(zSql);
  }
  if( rc ) goto end_deserialize;
  db->init.iDb = (u8)iDb;
  db->init.reopenMemdb = 1;
  rc = sqlite3_step(pStmt);
  db->init.reopenMemdb = 0;
  if( rc!=SQLITE_DONE ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  p = memdbFromDbSchema(db, zSchema);
  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    MemStore *pStore = p->pStore;
    pStore->aData = pData;
    pData = 0;
    pStore->sz = szDb;
    pStore->szAlloc = szBuf;
    pStore->szMax = szBuf;
    if( pStore->szMax<sqlite3GlobalConfig.mxMemdbSize ){
      pStore->szMax = sqlite3GlobalConfig.mxMemdbSize;
    }
    pStore->mFlags = mFlags;
    rc = SQLITE_OK;
  }

end_deserialize:
  sqlite3_finalize(pStmt);
  if( pData && (mFlags & SQLITE_DESERIALIZE_FREEONCLOSE)!=0 ){
    sqlite3_free(pData);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}